

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O2

exr_result_t
internal_exr_undo_rle
          (exr_decode_pipeline_t *decode,void *src,uint64_t packsz,void *out,uint64_t outsz)

{
  void **buf;
  char cVar1;
  exr_result_t eVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  buf = &decode->scratch_buffer_1;
  eVar2 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,buf,&decode->scratch_alloc_size_1,outsz);
  if (eVar2 == 0) {
    uVar3 = internal_rle_decompress((uint8_t *)*buf,outsz,(uint8_t *)src,packsz);
    if (uVar3 == outsz) {
      pcVar4 = (char *)*buf;
      pcVar7 = pcVar4;
      while (pcVar5 = pcVar7 + 1, pcVar5 < pcVar4 + outsz) {
        *pcVar5 = *pcVar5 + *pcVar7 + -0x80;
        pcVar7 = pcVar5;
      }
      pcVar5 = pcVar4 + (outsz + 1 >> 1);
      pcVar7 = (char *)out;
      while (pcVar6 = pcVar7, pcVar6 < (char *)(outsz + (long)out)) {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
        *pcVar6 = cVar1;
        pcVar7 = pcVar6 + 1;
        if (pcVar7 < (char *)(outsz + (long)out)) {
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + 1;
          *pcVar7 = cVar1;
          pcVar7 = pcVar6 + 2;
        }
      }
      eVar2 = 0;
    }
    else {
      eVar2 = 0x17;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_undo_rle (
    exr_decode_pipeline_t* decode,
    const void*            src,
    uint64_t               packsz,
    void*                  out,
    uint64_t               outsz)
{
    exr_result_t rv;
    uint64_t     unpackb;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        outsz);
    if (rv != EXR_ERR_SUCCESS) return rv;

    unpackb =
        internal_rle_decompress ((uint8_t*) decode->scratch_buffer_1, outsz, (const uint8_t*) src, packsz);
    if (unpackb != outsz) return EXR_ERR_CORRUPT_CHUNK;

    unpredict_and_reorder (out, decode->scratch_buffer_1, outsz);
    return EXR_ERR_SUCCESS;
}